

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall kj::EventLoop::~EventLoop(EventLoop *this)

{
  bool bVar1;
  TaskSet *this_00;
  Own<kj::TaskSet,_std::nullptr_t> *other;
  Own<kj::Executor,_std::nullptr_t> *this_01;
  Executor *pEVar2;
  Impl *this_02;
  long *in_FS_OFFSET;
  Fault local_f8;
  Fault f_1;
  EventLoop **local_e8;
  undefined1 local_e0 [8];
  DebugComparison<kj::EventLoop_*&,_kj::EventLoop_*> _kjCondition_1;
  Event *next;
  Event *event;
  Fault local_90;
  Fault f;
  Event **local_80;
  undefined1 local_78 [8];
  DebugComparison<kj::_::Event_*&,_std::nullptr_t> _kjCondition;
  Own<kj::Executor,_std::nullptr_t> *e;
  Own<kj::Executor,_std::nullptr_t> *_e1768;
  undefined1 local_30 [8];
  Own<kj::TaskSet,_std::nullptr_t> oldDaemons;
  EventLoop *this_local;
  
  while( true ) {
    this_00 = Own<kj::TaskSet,_std::nullptr_t>::operator->(&this->daemons);
    bVar1 = TaskSet::isEmpty(this_00);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    other = mv<kj::Own<kj::TaskSet,decltype(nullptr)>>(&this->daemons);
    Own<kj::TaskSet,_std::nullptr_t>::Own((Own<kj::TaskSet,_std::nullptr_t> *)local_30,other);
    heap<kj::TaskSet,kj::_::LoggingErrorHandler&>
              ((kj *)&_e1768,(LoggingErrorHandler *)&kj::_::LoggingErrorHandler::instance);
    Own<kj::TaskSet,_std::nullptr_t>::operator=
              (&this->daemons,(Own<kj::TaskSet,_std::nullptr_t> *)&_e1768);
    Own<kj::TaskSet,_std::nullptr_t>::~Own((Own<kj::TaskSet,_std::nullptr_t> *)&_e1768);
    Own<kj::TaskSet,_std::nullptr_t>::~Own((Own<kj::TaskSet,_std::nullptr_t> *)local_30);
  }
  Own<kj::TaskSet,_std::nullptr_t>::operator=(&this->daemons,(void *)0x0);
  this_01 = kj::_::readMaybe<kj::Executor,decltype(nullptr)>(&this->executor);
  if (this_01 != (Own<kj::Executor,_std::nullptr_t> *)0x0) {
    _kjCondition._32_8_ = this_01;
    pEVar2 = Own<kj::Executor,_std::nullptr_t>::operator->(this_01);
    this_02 = Own<kj::Executor::Impl,_std::nullptr_t>::operator->(&pEVar2->impl);
    Executor::Impl::disconnect(this_02);
  }
  local_80 = (Event **)
             kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&this->head);
  f.exception = (Exception *)0x0;
  kj::_::DebugExpression<kj::_::Event*&>::operator==
            ((DebugComparison<kj::_::Event_*&,_std::nullptr_t> *)local_78,
             (DebugExpression<kj::_::Event*&> *)&local_80,&f.exception);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_78);
  if (!bVar1) {
    kj::_::Event::traceEvent((String *)&event,this->head);
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<kj::_::Event*&,decltype(nullptr)>&,char_const(&)[66],kj::String>
              (&local_90,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
               ,0x6f0,FAILED,"head == nullptr",
               "_kjCondition,\"EventLoop destroyed with events still in the queue.  Memory leak?\", head->traceEvent()"
               ,(DebugComparison<kj::_::Event_*&,_std::nullptr_t> *)local_78,
               (char (*) [66])"EventLoop destroyed with events still in the queue.  Memory leak?",
               (String *)&event);
    String::~String((String *)&event);
    next = this->head;
    while (next != (Event *)0x0) {
      _kjCondition_1._32_8_ = next->next;
      next->next = (Event *)0x0;
      next->prev = (Event **)0x0;
      next = (Event *)_kjCondition_1._32_8_;
    }
    kj::_::Debug::Fault::~Fault(&local_90);
  }
  local_e8 = (EventLoop **)
             kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                        (EventLoop **)(*in_FS_OFFSET + -0x28));
  f_1.exception = (Exception *)this;
  kj::_::DebugExpression<kj::EventLoop*&>::operator!=
            ((DebugComparison<kj::EventLoop_*&,_kj::EventLoop_*> *)local_e0,
             (DebugExpression<kj::EventLoop*&> *)&local_e8,(EventLoop **)&f_1);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_e0);
  if (!bVar1) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<kj::EventLoop*&,kj::EventLoop*>&,char_const(&)[56]>
              (&local_f8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
               ,0x6fd,FAILED,"threadLocalEventLoop != this",
               "_kjCondition,\"EventLoop destroyed while still current for the thread.\"",
               (DebugComparison<kj::EventLoop_*&,_kj::EventLoop_*> *)local_e0,
               (char (*) [56])"EventLoop destroyed while still current for the thread.");
    in_FS_OFFSET[-5] = 0;
    kj::_::Debug::Fault::~Fault(&local_f8);
  }
  Own<kj::TaskSet,_std::nullptr_t>::~Own(&this->daemons);
  Maybe<kj::Own<kj::EventLoop::LocalMap,_std::nullptr_t>_>::~Maybe(&this->localMap);
  Maybe<kj::Own<kj::Executor,_std::nullptr_t>_>::~Maybe(&this->executor);
  return;
}

Assistant:

EventLoop::~EventLoop() noexcept(false) {
  // Destroy all "daemon" tasks, noting that their destructors might register more daemon tasks.
  while (!daemons->isEmpty()) {
    auto oldDaemons = kj::mv(daemons);
    daemons = kj::heap<TaskSet>(_::LoggingErrorHandler::instance);
  }
  daemons = nullptr;

  KJ_IF_SOME(e, executor) {
    // Cancel all outstanding cross-thread events.
    e->impl->disconnect();
  }

  // The application _should_ destroy everything using the EventLoop before destroying the
  // EventLoop itself, so if there are events on the loop, this indicates a memory leak.
  KJ_REQUIRE(head == nullptr, "EventLoop destroyed with events still in the queue.  Memory leak?",
             head->traceEvent()) {
    // Unlink all the events and hope that no one ever fires them...
    _::Event* event = head;
    while (event != nullptr) {
      _::Event* next = event->next;
      event->next = nullptr;
      event->prev = nullptr;
      event = next;
    }
    break;
  }

  KJ_REQUIRE(threadLocalEventLoop != this,
             "EventLoop destroyed while still current for the thread.") {
    threadLocalEventLoop = nullptr;
    break;
  }
}